

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Vec_StrPutS_(Vec_Str_t *vOut,char *Val)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  
  cVar5 = *Val;
  if (cVar5 != '\0') {
    pcVar6 = Val + 1;
    do {
      uVar1 = vOut->nSize;
      if (uVar1 == vOut->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(vOut->pArray,0x10);
          }
          vOut->pArray = pcVar4;
          vOut->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar1 * 2;
          if (vOut->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(sVar3);
          }
          else {
            pcVar4 = (char *)realloc(vOut->pArray,sVar3);
          }
          vOut->pArray = pcVar4;
          vOut->nCap = (int)sVar3;
        }
      }
      else {
        pcVar4 = vOut->pArray;
      }
      iVar2 = vOut->nSize;
      vOut->nSize = iVar2 + 1;
      pcVar4[iVar2] = cVar5;
      cVar5 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar5 != '\0');
  }
  uVar1 = vOut->nSize;
  if (uVar1 == vOut->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar6;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar3);
      }
      else {
        pcVar6 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar6;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar6 = vOut->pArray;
  }
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  pcVar6[iVar2] = '\0';
  return;
}

Assistant:

static inline void Vec_StrPutS_( Vec_Str_t * vOut, char * Val )  { Vec_StrPutS( vOut, Val );  }